

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O0

bool SetPropertyCommand::HandleSourceFileDirectoryScopes
               (cmExecutionStatus *status,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_directories,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *source_file_target_directories,
               vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *directory_makefiles)

{
  bool bVar1;
  reference in_path;
  cmTarget *this;
  cmMakefile *pcVar2;
  cmGlobalGenerator *pcVar3;
  string *psVar4;
  _Node_iterator_base<cmMakefile_*,_false> local_260;
  _Node_iterator_base<cmMakefile_*,_false> local_258;
  cmMakefile *local_250;
  cmMakefile *target_dir_mf;
  string local_240;
  cmValue local_220;
  cmValue target_source_dir;
  cmAlphaNum local_1e8;
  string local_1b8;
  cmTarget *local_198;
  cmTarget *target;
  string *target_name;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  _Node_iterator_base<cmMakefile_*,_false> local_160;
  _Node_iterator_base<cmMakefile_*,_false> local_158;
  int local_14c;
  cmAlphaNum local_148;
  cmAlphaNum local_118;
  string local_e8;
  cmMakefile *local_c8;
  cmMakefile *dir_mf;
  string absolute_dir_path;
  string *dir_path;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmMakefile *local_70;
  cmMakefile *current_dir_mf;
  unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
  directory_makefiles_set;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *directory_makefiles_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *source_file_target_directories_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *source_file_directories_local;
  cmExecutionStatus *status_local;
  
  directory_makefiles_set._M_h._M_single_bucket = (__node_base_ptr)directory_makefiles;
  std::
  unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
  ::unordered_set((unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
                   *)&current_dir_mf);
  local_70 = cmExecutionStatus::GetMakefile(status);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(source_file_directories);
  if (!bVar1) {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(source_file_directories);
    dir_path = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(source_file_directories);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&dir_path), bVar1) {
      in_path = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
      absolute_dir_path.field_2._8_8_ = in_path;
      psVar4 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_70);
      cmsys::SystemTools::CollapseFullPath((string *)&dir_mf,in_path,psVar4);
      pcVar2 = cmExecutionStatus::GetMakefile(status);
      pcVar3 = cmMakefile::GetGlobalGenerator(pcVar2);
      local_c8 = cmGlobalGenerator::FindMakefile(pcVar3,(string *)&dir_mf);
      if (local_c8 == (cmMakefile *)0x0) {
        cmAlphaNum::cmAlphaNum(&local_118,"given non-existent DIRECTORY ");
        cmAlphaNum::cmAlphaNum(&local_148,(string *)absolute_dir_path.field_2._8_8_);
        cmStrCat<>(&local_e8,&local_118,&local_148);
        cmExecutionStatus::SetError(status,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        status_local._7_1_ = 0;
        local_14c = 1;
      }
      else {
        local_158._M_cur =
             (__node_type *)
             std::
             unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
             ::find((unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
                     *)&current_dir_mf,&local_c8);
        local_160._M_cur =
             (__node_type *)
             std::
             unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
             ::end((unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
                    *)&current_dir_mf);
        bVar1 = std::__detail::operator==(&local_158,&local_160);
        if (bVar1) {
          std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
                    ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)
                     directory_makefiles_set._M_h._M_single_bucket,&local_c8);
          std::
          unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
          ::insert((unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
                    *)&current_dir_mf,&local_c8);
        }
        local_14c = 0;
      }
      std::__cxx11::string::~string((string *)&dir_mf);
      if (local_14c != 0) goto LAB_003528e7;
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(source_file_target_directories);
  if (!bVar1) {
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(source_file_target_directories);
    target_name = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(source_file_target_directories);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&target_name), bVar1) {
      target = (cmTarget *)
               __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2_1);
      this = cmMakefile::FindTargetToUse(local_70,(string *)target,false);
      local_198 = this;
      if (this == (cmTarget *)0x0) {
        cmAlphaNum::cmAlphaNum(&local_1e8,"given non-existent target for TARGET_DIRECTORY ");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&target_source_dir,(string *)target);
        cmStrCat<>(&local_1b8,&local_1e8,(cmAlphaNum *)&target_source_dir);
        cmExecutionStatus::SetError(status,&local_1b8);
        std::__cxx11::string::~string((string *)&local_1b8);
        status_local._7_1_ = 0;
        local_14c = 1;
        goto LAB_003528e7;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,"BINARY_DIR",(allocator<char> *)((long)&target_dir_mf + 7));
      local_220 = cmTarget::GetProperty(this,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator((allocator<char> *)((long)&target_dir_mf + 7));
      pcVar2 = cmExecutionStatus::GetMakefile(status);
      pcVar3 = cmMakefile::GetGlobalGenerator(pcVar2);
      psVar4 = cmValue::operator*[abi_cxx11_(&local_220);
      local_250 = cmGlobalGenerator::FindMakefile(pcVar3,psVar4);
      local_258._M_cur =
           (__node_type *)
           std::
           unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
           ::find((unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
                   *)&current_dir_mf,&local_250);
      local_260._M_cur =
           (__node_type *)
           std::
           unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
           ::end((unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
                  *)&current_dir_mf);
      bVar1 = std::__detail::operator==(&local_258,&local_260);
      if (bVar1) {
        std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
                  ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)
                   directory_makefiles_set._M_h._M_single_bucket,&local_250);
        std::
        unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
        ::insert((unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
                  *)&current_dir_mf,&local_250);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(source_file_directories);
  if ((bVar1) &&
     (bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(source_file_target_directories), bVar1)) {
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
              ((vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)
               directory_makefiles_set._M_h._M_single_bucket,&local_70);
  }
  status_local._7_1_ = 1;
  local_14c = 1;
LAB_003528e7:
  std::
  unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
  ::~unordered_set((unordered_set<cmMakefile_*,_std::hash<cmMakefile_*>,_std::equal_to<cmMakefile_*>,_std::allocator<cmMakefile_*>_>
                    *)&current_dir_mf);
  return (bool)(status_local._7_1_ & 1);
}

Assistant:

bool HandleSourceFileDirectoryScopes(
  cmExecutionStatus& status, std::vector<std::string>& source_file_directories,
  std::vector<std::string>& source_file_target_directories,
  std::vector<cmMakefile*>& directory_makefiles)
{
  std::unordered_set<cmMakefile*> directory_makefiles_set;

  cmMakefile* current_dir_mf = &status.GetMakefile();
  if (!source_file_directories.empty()) {
    for (const std::string& dir_path : source_file_directories) {
      const std::string absolute_dir_path = cmSystemTools::CollapseFullPath(
        dir_path, current_dir_mf->GetCurrentSourceDirectory());
      cmMakefile* dir_mf =
        status.GetMakefile().GetGlobalGenerator()->FindMakefile(
          absolute_dir_path);
      if (!dir_mf) {
        status.SetError(cmStrCat("given non-existent DIRECTORY ", dir_path));
        return false;
      }
      if (directory_makefiles_set.find(dir_mf) ==
          directory_makefiles_set.end()) {
        directory_makefiles.push_back(dir_mf);
        directory_makefiles_set.insert(dir_mf);
      }
    }
  }

  if (!source_file_target_directories.empty()) {
    for (const std::string& target_name : source_file_target_directories) {
      cmTarget* target = current_dir_mf->FindTargetToUse(target_name);
      if (!target) {
        status.SetError(cmStrCat(
          "given non-existent target for TARGET_DIRECTORY ", target_name));
        return false;
      }
      cmValue target_source_dir = target->GetProperty("BINARY_DIR");
      cmMakefile* target_dir_mf =
        status.GetMakefile().GetGlobalGenerator()->FindMakefile(
          *target_source_dir);

      if (directory_makefiles_set.find(target_dir_mf) ==
          directory_makefiles_set.end()) {
        directory_makefiles.push_back(target_dir_mf);
        directory_makefiles_set.insert(target_dir_mf);
      }
    }
  }

  if (source_file_directories.empty() &&
      source_file_target_directories.empty()) {
    directory_makefiles.push_back(current_dir_mf);
  }
  return true;
}